

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_cdn_domain_logs.cc
# Opt level: O0

void anon_unknown.dwarf_1ee46::Json2Type
               (Value *value,CdnDescribeCdnDomainLogsDomainLogDetailType *item)

{
  bool bVar1;
  Int IVar2;
  Value *pVVar3;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  CdnDescribeCdnDomainLogsDomainLogDetailType *local_18;
  CdnDescribeCdnDomainLogsDomainLogDetailType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (CdnDescribeCdnDomainLogsDomainLogDetailType *)value;
  bVar1 = Json::Value::isMember(value,"LogName");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"LogName");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar3);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"LogPath");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"LogPath");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->log_path,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"LogSize");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"LogSize");
    IVar2 = Json::Value::asInt(pVVar3);
    local_18->log_size = (long)IVar2;
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"StartTime");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"StartTime");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->start_time,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"EndTime");
  if (bVar1) {
    pVVar3 = Json::Value::operator[]((Value *)item_local,"EndTime");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar3);
    std::__cxx11::string::operator=((string *)&local_18->end_time,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, CdnDescribeCdnDomainLogsDomainLogDetailType* item) {
  if(value.isMember("LogName")) {
    item->log_name = value["LogName"].asString();
  }
  if(value.isMember("LogPath")) {
    item->log_path = value["LogPath"].asString();
  }
  if(value.isMember("LogSize")) {
    item->log_size = value["LogSize"].asInt();
  }
  if(value.isMember("StartTime")) {
    item->start_time = value["StartTime"].asString();
  }
  if(value.isMember("EndTime")) {
    item->end_time = value["EndTime"].asString();
  }
}